

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recvfrom_op.hpp
# Opt level: O2

status asio::detail::
       reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
       ::do_perform(reactor_op *base)

{
  bool bVar1;
  size_t addr_len;
  
  addr_len = 0x1c;
  bVar1 = socket_ops::non_blocking_recvfrom1
                    (*(socket_type *)&base[1].super_operation.next_,base[1].super_operation.func_,
                     *(size_t *)&base[1].super_operation.task_result_,*(int *)&base[1].ec_._M_cat,
                     *(void **)&base[1].ec_,&addr_len,&base->ec_,&base->bytes_transferred_);
  if ((bVar1) && ((base->ec_)._M_value == 0)) {
    asio::ip::detail::endpoint::resize(*(endpoint **)&base[1].ec_,addr_len);
  }
  return (status)bVar1;
}

Assistant:

static status do_perform(reactor_op* base)
  {
    ASIO_ASSUME(base != 0);
    reactive_socket_recvfrom_op_base* o(
        static_cast<reactive_socket_recvfrom_op_base*>(base));

    typedef buffer_sequence_adapter<asio::mutable_buffer,
        MutableBufferSequence> bufs_type;

    std::size_t addr_len = o->sender_endpoint_.capacity();
    status result;
    if (bufs_type::is_single_buffer)
    {
      result = socket_ops::non_blocking_recvfrom1(
          o->socket_, bufs_type::first(o->buffers_).data(),
          bufs_type::first(o->buffers_).size(), o->flags_,
          o->sender_endpoint_.data(), &addr_len,
          o->ec_, o->bytes_transferred_) ? done : not_done;
    }
    else
    {
      bufs_type bufs(o->buffers_);
      result = socket_ops::non_blocking_recvfrom(o->socket_,
          bufs.buffers(), bufs.count(), o->flags_,
          o->sender_endpoint_.data(), &addr_len,
          o->ec_, o->bytes_transferred_) ? done : not_done;
    }

    if (result && !o->ec_)
      o->sender_endpoint_.resize(addr_len);

    ASIO_HANDLER_REACTOR_OPERATION((*o, "non_blocking_recvfrom",
          o->ec_, o->bytes_transferred_));

    return result;
  }